

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::Read
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZStream *buf,void *context)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZStream *in_RDI;
  int is_1;
  int is;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  TPZGeoCube::Read((TPZGeoCube *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_RDI,(void *)0x163e8fb);
  for (iVar1 = 0; iVar1 < 0x14; iVar1 = iVar1 + 1) {
    (*in_RDI[(long)iVar1 * 3 + 10]._vptr_TPZStream[6])(in_RDI + (long)iVar1 * 3 + 10,in_RSI,in_RDX);
  }
  for (iVar1 = 0; iVar1 < 0x14; iVar1 = iVar1 + 1) {
    (*in_RDI[(long)iVar1 * 0x34 + 0x46]._vptr_TPZStream[6])
              (in_RDI + (long)iVar1 * 0x34 + 0x46,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void Read(TPZStream &buf, void *context) override{
            TGeo::Read(buf, context);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Read(buf, context);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Read(buf, context);
            }
        }